

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbTruncate(sqlite3_file *pFile,sqlite_int64 size)

{
  long *plVar1;
  long in_RSI;
  long in_RDI;
  int rc;
  MemStore *p;
  undefined4 local_1c;
  
  plVar1 = *(long **)(in_RDI + 8);
  local_1c = 0;
  memdbEnter((MemStore *)0x158012);
  if (*plVar1 < in_RSI) {
    local_1c = 0xb;
  }
  else {
    *plVar1 = in_RSI;
  }
  memdbLeave((MemStore *)0x158042);
  return local_1c;
}

Assistant:

static int memdbTruncate(sqlite3_file *pFile, sqlite_int64 size){
  MemStore *p = ((MemFile*)pFile)->pStore;
  int rc = SQLITE_OK;
  memdbEnter(p);
  if( size>p->sz ){
    /* This can only happen with a corrupt wal mode db */
    rc = SQLITE_CORRUPT;
  }else{
    p->sz = size;
  }
  memdbLeave(p);
  return rc;
}